

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

int ui32fromtoken(Context_conflict2 *ctx,uint32 *_val)

{
  uint uVar1;
  uint32 uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = ctx->tokenlen;
  if (uVar1 == 0) {
LAB_0014f3bf:
    uVar2 = 0;
    iVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if ((byte)(ctx->token[uVar3] - 0x3aU) < 0xf6) {
        if ((int)uVar3 != 0) goto LAB_0014f37e;
        goto LAB_0014f3bf;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != (uint)uVar3);
    uVar3 = (ulong)uVar1;
LAB_0014f37e:
    uVar2 = 0;
    iVar4 = 1;
    uVar5 = uVar3 & 0xffffffff;
    do {
      uVar2 = uVar2 + (ctx->token[uVar5 - 1] + -0x30) * iVar4;
      iVar4 = iVar4 * 10;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    ctx->token = ctx->token + (uVar3 & 0xffffffff);
    ctx->tokenlen = uVar1 - (int)uVar3;
    iVar4 = 1;
  }
  *_val = uVar2;
  return iVar4;
}

Assistant:

static int ui32fromtoken(Context *ctx, uint32 *_val)
{
    unsigned int i;
    for (i = 0; i < ctx->tokenlen; i++)
    {
        if ((ctx->token[i] < '0') || (ctx->token[i] > '9'))
            break;
    } // for

    if (i == 0)
    {
        *_val = 0;
        return 0;
    } // if

    const unsigned int len = i;
    uint32 val = 0;
    uint32 mult = 1;
    while (i--)
    {
        val += ((uint32) (ctx->token[i] - '0')) * mult;
        mult *= 10;
    } // while

    ctx->token += len;
    ctx->tokenlen -= len;

    *_val = val;
    return 1;
}